

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float32_to_float128_mips64el(float32 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint64_t uVar4;
  uint uVar5;
  ulong uVar6;
  float128 fVar7;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  uVar3 = a & 0x7fffff;
  uVar6 = (ulong)(a >> 0x1f);
  if ((char)(a >> 0x17) == '\0') {
    if (uVar3 == 0) {
      uVar6 = uVar6 << 0x3f;
LAB_0091b7ff:
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      return (float128)(auVar2 << 0x40);
    }
    uVar5 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar3 = uVar3 << ((char)(uVar5 ^ 0x1f) - 8U & 0x1f);
    uVar5 = 8 - (uVar5 ^ 0x1f);
LAB_0091b7d5:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ((ulong)(uVar5 + 0x3f80) << 0x30) + (uVar6 << 0x3f | (ulong)uVar3 << 0x19);
    return (float128)(auVar1 << 0x40);
  }
  uVar5 = a >> 0x17 & 0xff;
  if (uVar5 != 0xff) goto LAB_0091b7d5;
  if (uVar3 == 0) {
    uVar6 = uVar6 << 0x3f | 0x7fff000000000000;
    goto LAB_0091b7ff;
  }
  if (status->snan_bit_is_one == '\0') {
    if ((a & 0x3fffff) == 0 || (a & 0x7fc00000) != 0x7f800000) goto LAB_0091b790;
  }
  else if (a * 2 < 0xff800000) goto LAB_0091b790;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_0091b790:
  if (status->default_nan_mode == '\0') {
    uVar6 = uVar6 << 0x3f | (ulong)(a & 0x7fffff) << 0x19;
    uVar4 = 0;
  }
  else {
    uVar6 = 0x2000000000000000;
    if (status->snan_bit_is_one != '\0') {
      uVar6 = 0x1fffffffffffffff;
    }
    uVar4 = -(ulong)((uint)uVar6 & 1);
    uVar6 = uVar6 >> 0xe;
  }
  fVar7.high = uVar6 | 0x7fff000000000000;
  fVar7.low = uVar4;
  return fVar7;
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}